

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O3

unique_ptr<duckdb::ListAggregatesBindData,_std::default_delete<duckdb::ListAggregatesBindData>,_true>
 __thiscall
duckdb::ListAggregatesBindData::Deserialize(ListAggregatesBindData *this,Deserializer *deserializer)

{
  int iVar1;
  ListAggregatesBindData *this_00;
  pointer *__ptr;
  LogicalType stype;
  undefined1 local_38 [32];
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,1,"stype");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize((LogicalType *)(local_38 + 8),deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,2,"aggr_expr");
  iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
  if ((char)iVar1 == '\0') {
    local_38._0_8_ = (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
  }
  else {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    Expression::Deserialize((Expression *)local_38,deserializer);
    (*deserializer->_vptr_Deserializer[7])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[0xb])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this_00 = (ListAggregatesBindData *)operator_new(0x28);
  ListAggregatesBindData
            (this_00,(LogicalType *)(local_38 + 8),
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             local_38);
  (this->super_FunctionData)._vptr_FunctionData = (_func_int **)this_00;
  if ((Expression *)local_38._0_8_ != (Expression *)0x0) {
    (*((BaseExpression *)local_38._0_8_)->_vptr_BaseExpression[1])();
  }
  LogicalType::~LogicalType((LogicalType *)(local_38 + 8));
  return (unique_ptr<duckdb::ListAggregatesBindData,_std::default_delete<duckdb::ListAggregatesBindData>_>
          )(unique_ptr<duckdb::ListAggregatesBindData,_std::default_delete<duckdb::ListAggregatesBindData>_>
            )this;
}

Assistant:

static unique_ptr<ListAggregatesBindData> Deserialize(Deserializer &deserializer) {
		auto stype = deserializer.ReadProperty<LogicalType>(1, "stype");
		auto aggr_expr = deserializer.ReadProperty<unique_ptr<Expression>>(2, "aggr_expr");
		auto result = make_uniq<ListAggregatesBindData>(std::move(stype), std::move(aggr_expr));
		return result;
	}